

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxNode *args_1;
  SyntaxNode *args_4;
  SyntaxList<slang::syntax::MemberSyntax> *args_7;
  CoverpointSyntax *pCVar1;
  DeepCloneVisitor visitor_2;
  DeepCloneVisitor visitor;
  NamedLabelSyntax *local_60;
  CoverageIffClauseSyntax *local_58;
  Token local_50;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x50),&visitor,(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x58) == (SyntaxNode *)0x0) {
    local_60 = (NamedLabelSyntax *)0x0;
  }
  else {
    local_60 = (NamedLabelSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x58),&visitor,(BumpAllocator *)__child_stack);
  }
  _visitor = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  args_4 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x70),&visitor_2,(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x78) == (SyntaxNode *)0x0) {
    local_58 = (CoverageIffClauseSyntax *)0x0;
  }
  else {
    local_58 = (CoverageIffClauseSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x78),&visitor_2,(BumpAllocator *)__child_stack);
  }
  _visitor_2 = parsing::Token::deepClone((Token *)(__fn + 0x80),(BumpAllocator *)__child_stack);
  args_7 = deepClone<slang::syntax::MemberSyntax>
                     ((SyntaxList<slang::syntax::MemberSyntax> *)(__fn + 0x90),
                      (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 200),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0xd8),(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CoverpointSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::DataTypeSyntax&,slang::syntax::NamedLabelSyntax*,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::syntax::CoverageIffClauseSyntax*,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,(DataTypeSyntax *)args_1,&local_60,
                      (Token *)&visitor,(ExpressionSyntax *)args_4,&local_58,(Token *)&visitor_2,
                      args_7,&local_40,&local_50);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CoverpointSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CoverpointSyntax>(
        *deepClone(node.attributes, alloc),
        *deepClone<DataTypeSyntax>(*node.type, alloc),
        node.label ? deepClone(*node.label, alloc) : nullptr,
        node.coverpoint.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.iff ? deepClone(*node.iff, alloc) : nullptr,
        node.openBrace.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.closeBrace.deepClone(alloc),
        node.emptySemi.deepClone(alloc)
    );
}